

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O1

word Abc_Isop14Cover(word *pOn,word *pOnDc,word *pRes,word CostLim,int *pCover)

{
  int *piVar1;
  byte *pbVar2;
  long lVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  word uOn2 [128];
  word uRes1 [128];
  word uRes0 [128];
  word uRes2 [128];
  word uOnDc2 [128];
  word local_1438 [128];
  word local_1038 [128];
  word local_c38 [128];
  word local_838 [128];
  word local_438 [129];
  
  lVar3 = 0;
  do {
    local_1438[lVar3] = ~pOnDc[lVar3 + 0x80] & pOn[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  wVar4 = Abc_IsopCheck(local_1438,pOnDc,local_c38,0xd,CostLim,pCover);
  if (wVar4 < CostLim) {
    lVar3 = 0;
    do {
      local_1438[lVar3] = ~pOnDc[lVar3] & pOn[lVar3 + 0x80];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x80);
    piVar1 = pCover + ((long)wVar4 >> 0x20);
    piVar9 = piVar1;
    if (pCover == (int *)0x0) {
      piVar9 = (int *)0x0;
    }
    wVar5 = Abc_IsopCheck(local_1438,pOnDc + 0x80,local_1038,0xd,CostLim,piVar9);
    if (wVar5 + wVar4 < CostLim) {
      lVar3 = 0;
      do {
        *(ulong *)((long)local_1438 + lVar3) =
             ~*(ulong *)((long)local_1038 + lVar3) & *(ulong *)((long)pOn + lVar3 + 0x400) |
             ~*(ulong *)((long)local_c38 + lVar3) & *(ulong *)((long)pOn + lVar3);
        *(ulong *)((long)local_438 + lVar3) =
             *(ulong *)((long)pOnDc + lVar3 + 0x400) & *(ulong *)((long)pOnDc + lVar3);
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x400);
      piVar9 = piVar1 + ((long)wVar5 >> 0x20);
      if (pCover == (int *)0x0) {
        piVar9 = (int *)0x0;
      }
      wVar6 = Abc_IsopCheck(local_1438,local_438,local_838,0xd,CostLim,piVar9);
      uVar7 = wVar6 + wVar5 + wVar4;
      if (uVar7 < CostLim) {
        lVar3 = 0;
        do {
          uVar8 = local_838[lVar3];
          pRes[lVar3] = local_c38[lVar3] | uVar8;
          pRes[lVar3 + 0x80] = uVar8 | local_1038[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x80);
        lVar3 = 0;
        do {
          if (((pOn[lVar3] & ~pRes[lVar3]) != 0) || ((pRes[lVar3] & ~pOnDc[lVar3]) != 0)) {
            __assert_fail("(pOn[c] & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                          ,0x170,"word Abc_Isop14Cover(word *, word *, word *, word, int *)");
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x100);
        if (pCover != (int *)0x0) {
          if (0 < (int)(wVar4 >> 0x20)) {
            uVar8 = 0;
            do {
              pbVar2 = (byte *)((long)pCover + uVar8 * 4 + 3);
              *pbVar2 = *pbVar2 | 4;
              uVar8 = uVar8 + 1;
            } while (wVar4 >> 0x20 != uVar8);
          }
          if (0 < (int)(wVar5 >> 0x20)) {
            uVar8 = 0;
            do {
              pbVar2 = (byte *)((long)piVar1 + uVar8 * 4 + 3);
              *pbVar2 = *pbVar2 | 8;
              uVar8 = uVar8 + 1;
            } while (wVar5 >> 0x20 != uVar8);
          }
        }
        CostLim = ((long)wVar5 >> 0x20) + ((long)wVar4 >> 0x20) + uVar7;
      }
    }
  }
  return CostLim;
}

Assistant:

word Abc_Isop14Cover( word * pOn, word * pOnDc, word * pRes, word CostLim, int * pCover )
{
    word uOn2[128], uOnDc2[128], uRes0[128], uRes1[128], uRes2[128];
    word Cost0, Cost1, Cost2; int c, nVars = 13, nWords = 128;
    // negative cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c] & ~pOnDc[c+nWords];
    Cost0 = Abc_IsopCheck( uOn2, pOnDc,        uRes0, nVars, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    // positive cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c+nWords] & ~pOnDc[c];
    Cost1 = Abc_IsopCheck( uOn2, pOnDc+nWords, uRes1, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    // middle cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = (pOn[c] & ~uRes0[c]) | (pOn[c+nWords] & ~uRes1[c]), uOnDc2[c] = pOnDc[c] & pOnDc[c+nWords];
    Cost2 = Abc_IsopCheck( uOn2, uOnDc2,       uRes2, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    for ( c = 0; c < nWords; c++ )
        pRes[c] = uRes2[c] | uRes0[c], pRes[c+nWords] = uRes2[c] | uRes1[c];
    // verify
    for ( c = 0; c < (nWords<<1); c++ )
        assert( (pOn[c]  & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, nVars );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}